

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

iterator_range<llvm::AppleAcceleratorTable::ValueIterator> * __thiscall
llvm::AppleAcceleratorTable::equal_range
          (iterator_range<llvm::AppleAcceleratorTable::ValueIterator> *__return_storage_ptr__,
          AppleAcceleratorTable *this,StringRef Key)

{
  StringRef LHS;
  bool bVar1;
  uint32_t uVar2;
  char *Str;
  StringRef Buffer;
  ValueIterator local_598;
  ValueIterator local_4c8;
  ValueIterator local_3f8;
  ValueIterator local_328;
  StringRef local_260;
  AppleAcceleratorTable *local_250;
  char *local_248;
  uint64_t local_240;
  uint64_t StringOffset;
  uint64_t DataOffset;
  uint64_t uStack_228;
  uint32_t Hash;
  uint64_t OffsetsOffset;
  uint64_t HashOffset;
  uint HashIdx;
  uint Index;
  uint64_t BucketOffset;
  uint64_t OffsetsBase;
  uint64_t HashesBase;
  uint64_t BucketBase;
  AppleAcceleratorTable *pAStack_1e8;
  uint Bucket;
  char *local_1e0;
  uint32_t local_1d8;
  uint HashValue;
  ValueIterator local_1c8;
  ValueIterator local_f8;
  AppleAcceleratorTable *local_28;
  AppleAcceleratorTable *this_local;
  StringRef Key_local;
  
  local_1e0 = (char *)Key.Length;
  pAStack_1e8 = (AppleAcceleratorTable *)Key.Data;
  local_28 = this;
  this_local = pAStack_1e8;
  Key_local.Data = local_1e0;
  Key_local.Length = (size_t)__return_storage_ptr__;
  if ((this->IsValid & 1U) == 0) {
    local_f8.Current.HdrData = (HeaderData *)0x0;
    local_f8.DataOffset = 0;
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x20] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x21] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x22] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x23] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x24] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x25] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x26] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x27] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x28] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x29] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2a] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2b] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2c] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2d] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2e] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2f] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x10] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x11] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x12] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x13] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x14] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x15] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x16] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x17] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x18] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x19] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1a] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1b] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1c] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1d] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1e] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1f] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[1] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[2] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[3] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[4] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[5] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[6] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[7] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[8] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[9] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[10] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0xb] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0xc] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0xd] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0xe] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0xf] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x20] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x21] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x22] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x23] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x24] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x25] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x26] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x27] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x28] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x29] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2a] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2b] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2c] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2d] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2e] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2f] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x10] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x11] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x12] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x13] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x14] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x15] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x16] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x17] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x18] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x19] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1a] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1b] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1c] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1d] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1e] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1f] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[1] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[2] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[3] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[4] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[5] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[6] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[7] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[8] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[9] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[10] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0xb] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0xc] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0xd] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0xe] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0xf] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x20] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x21] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x22] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x23] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x24] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x25] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x26] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x27] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x28] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x29] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2a] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2b] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2c] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2d] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2e] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2f] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x10] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x11] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x12] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x13] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x14] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x15] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x16] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x17] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x18] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x19] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1a] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1b] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1c] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1d] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1e] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1f] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[1] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[2] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[3] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[4] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[5] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[6] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[7] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[8] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[9] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[10] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0xb] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0xc] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0xd] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0xe] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0xf] = '\0';
    local_f8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
         (void *)0x0;
    local_f8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size = 0;
    local_f8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity = 0;
    local_f8.AccelTable = (AppleAcceleratorTable *)0x0;
    local_f8.Current.super_Entry._vptr_Entry = (_func_int **)0x0;
    local_f8.Data = 0;
    local_f8.NumData = 0;
    ValueIterator::ValueIterator(&local_f8);
    local_1c8.Current.HdrData = (HeaderData *)0x0;
    local_1c8.DataOffset = 0;
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x20] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x21] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x22] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x23] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x24] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x25] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x26] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x27] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x28] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x29] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2a] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2b] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2c] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2d] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2e] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2f] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x10] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x11] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x12] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x13] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x14] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x15] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x16] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x17] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x18] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x19] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1a] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1b] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1c] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1d] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1e] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1f] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[1] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[2] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[3] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[4] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[5] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[6] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[7] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[8] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[9] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[10] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0xb] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0xc] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0xd] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0xe] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0xf] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x20] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x21] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x22] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x23] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x24] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x25] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x26] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x27] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x28] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x29] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2a] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2b] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2c] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2d] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2e] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2f] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x10] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x11] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x12] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x13] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x14] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x15] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x16] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x17] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x18] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x19] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1a] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1b] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1c] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1d] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1e] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1f] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[1] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[2] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[3] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[4] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[5] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[6] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[7] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[8] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[9] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[10] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0xb] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0xc] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0xd] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0xe] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0xf] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x20] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x21] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x22] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x23] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x24] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x25] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x26] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x27] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x28] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x29] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2a] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2b] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2c] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2d] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2e] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2f] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x10] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x11] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x12] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x13] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x14] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x15] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x16] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x17] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x18] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x19] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1a] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1b] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1c] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1d] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1e] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1f] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[1] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[2] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[3] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[4] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[5] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[6] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[7] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[8] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[9] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[10] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0xb] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0xc] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0xd] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0xe] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0xf] = '\0';
    local_1c8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
         (void *)0x0;
    local_1c8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size = 0;
    local_1c8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity = 0;
    local_1c8.AccelTable = (AppleAcceleratorTable *)0x0;
    local_1c8.Current.super_Entry._vptr_Entry = (_func_int **)0x0;
    local_1c8.Data = 0;
    local_1c8.NumData = 0;
    ValueIterator::ValueIterator(&local_1c8);
    make_range<llvm::AppleAcceleratorTable::ValueIterator>
              (__return_storage_ptr__,&local_f8,&local_1c8);
    ValueIterator::~ValueIterator(&local_1c8);
    ValueIterator::~ValueIterator(&local_f8);
  }
  else {
    Buffer.Length = 0x1505;
    Buffer.Data = local_1e0;
    local_1d8 = djbHash((llvm *)pAStack_1e8,Buffer,(uint32_t)Key.Length);
    BucketBase._4_4_ = local_1d8 % (this->Hdr).BucketCount;
    HashesBase = (ulong)(this->Hdr).HeaderDataLength + 0x14;
    OffsetsBase = HashesBase + ((this->Hdr).BucketCount << 2);
    BucketOffset = OffsetsBase + ((this->Hdr).HashCount << 2);
    _HashIdx = HashesBase + (BucketBase._4_4_ << 2);
    HashOffset._0_4_ =
         DataExtractor::getU32
                   (&(this->super_DWARFAcceleratorTable).AccelSection.super_DataExtractor,
                    (uint64_t *)&HashIdx,(Error *)0x0);
    HashOffset._4_4_ = (uint32_t)HashOffset;
    for (; (uint32_t)HashOffset < (this->Hdr).HashCount; HashOffset._0_4_ = (uint32_t)HashOffset + 1
        ) {
      OffsetsOffset = OffsetsBase + ((uint32_t)HashOffset << 2);
      uStack_228 = BucketOffset + ((uint32_t)HashOffset << 2);
      DataOffset._4_4_ =
           DataExtractor::getU32
                     (&(this->super_DWARFAcceleratorTable).AccelSection.super_DataExtractor,
                      &OffsetsOffset,(Error *)0x0);
      if (DataOffset._4_4_ % (this->Hdr).BucketCount != BucketBase._4_4_) break;
      uVar2 = DataExtractor::getU32
                        (&(this->super_DWARFAcceleratorTable).AccelSection.super_DataExtractor,
                         &stack0xfffffffffffffdd8,(Error *)0x0);
      StringOffset = (uint64_t)uVar2;
      local_240 = DWARFDataExtractor::getRelocatedValue
                            (&(this->super_DWARFAcceleratorTable).AccelSection,4,&StringOffset,
                             (uint64_t *)0x0,(Error *)0x0);
      if (local_240 == 0) break;
      local_250 = this_local;
      local_248 = Key_local.Data;
      Str = DataExtractor::getCStr(&(this->super_DWARFAcceleratorTable).StringSection,&local_240);
      StringRef::StringRef(&local_260,Str);
      LHS.Length = (size_t)local_248;
      LHS.Data = (char *)local_250;
      bVar1 = llvm::operator==(LHS,local_260);
      if (bVar1) {
        ValueIterator::ValueIterator(&local_328,this,StringOffset);
        local_3f8.Current.HdrData = (HeaderData *)0x0;
        local_3f8.DataOffset = 0;
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x20] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x21] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x22] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x23] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x24] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x25] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x26] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x27] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x28] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x29] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x2a] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x2b] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x2c] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x2d] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x2e] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x2f] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x10] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x11] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x12] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x13] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x14] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x15] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x16] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x17] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x18] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x19] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x1a] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x1b] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x1c] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x1d] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x1e] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0x1f] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[1] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[2] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[3] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[4] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[5] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[6] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[7] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[8] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[9] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[10] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0xb] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0xc] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0xd] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0xe] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[2].buffer[0xf] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x20] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x21] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x22] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x23] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x24] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x25] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x26] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x27] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x28] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x29] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x2a] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x2b] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x2c] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x2d] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x2e] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x2f] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x10] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x11] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x12] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x13] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x14] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x15] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x16] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x17] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x18] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x19] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x1a] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x1b] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x1c] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x1d] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x1e] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0x1f] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[1] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[2] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[3] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[4] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[5] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[6] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[7] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[8] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[9] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[10] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0xb] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0xc] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0xd] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0xe] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[1].buffer[0xf] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x20] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x21] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x22] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x23] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x24] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x25] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x26] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x27] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x28] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x29] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x2a] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x2b] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x2c] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x2d] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x2e] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x2f] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x10] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x11] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x12] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x13] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x14] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x15] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x16] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x17] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x18] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x19] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x1a] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x1b] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x1c] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x1d] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x1e] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0x1f] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[1] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[2] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[3] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[4] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[5] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[6] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[7] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[8] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[9] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[10] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0xb] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0xc] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0xd] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0xe] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
        InlineElts[0].buffer[0xf] = '\0';
        local_3f8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
        super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
        super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
             (void *)0x0;
        local_3f8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
        super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
        super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size = 0;
        local_3f8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
        super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
        super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity =
             0;
        local_3f8.AccelTable = (AppleAcceleratorTable *)0x0;
        local_3f8.Current.super_Entry._vptr_Entry = (_func_int **)0x0;
        local_3f8.Data = 0;
        local_3f8.NumData = 0;
        ValueIterator::ValueIterator(&local_3f8);
        make_range<llvm::AppleAcceleratorTable::ValueIterator>
                  (__return_storage_ptr__,&local_328,&local_3f8);
        ValueIterator::~ValueIterator(&local_3f8);
        ValueIterator::~ValueIterator(&local_328);
        return __return_storage_ptr__;
      }
    }
    local_4c8.Current.HdrData = (HeaderData *)0x0;
    local_4c8.DataOffset = 0;
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x20] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x21] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x22] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x23] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x24] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x25] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x26] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x27] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x28] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x29] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2a] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2b] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2c] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2d] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2e] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2f] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x10] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x11] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x12] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x13] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x14] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x15] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x16] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x17] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x18] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x19] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1a] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1b] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1c] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1d] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1e] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1f] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[1] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[2] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[3] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[4] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[5] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[6] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[7] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[8] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[9] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[10] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0xb] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0xc] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0xd] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0xe] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0xf] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x20] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x21] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x22] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x23] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x24] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x25] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x26] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x27] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x28] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x29] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2a] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2b] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2c] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2d] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2e] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2f] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x10] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x11] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x12] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x13] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x14] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x15] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x16] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x17] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x18] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x19] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1a] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1b] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1c] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1d] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1e] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1f] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[1] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[2] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[3] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[4] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[5] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[6] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[7] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[8] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[9] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[10] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0xb] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0xc] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0xd] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0xe] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0xf] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x20] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x21] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x22] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x23] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x24] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x25] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x26] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x27] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x28] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x29] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2a] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2b] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2c] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2d] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2e] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2f] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x10] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x11] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x12] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x13] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x14] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x15] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x16] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x17] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x18] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x19] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1a] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1b] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1c] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1d] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1e] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1f] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[1] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[2] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[3] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[4] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[5] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[6] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[7] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[8] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[9] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[10] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0xb] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0xc] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0xd] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0xe] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0xf] = '\0';
    local_4c8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
         (void *)0x0;
    local_4c8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size = 0;
    local_4c8.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity = 0;
    local_4c8.AccelTable = (AppleAcceleratorTable *)0x0;
    local_4c8.Current.super_Entry._vptr_Entry = (_func_int **)0x0;
    local_4c8.Data = 0;
    local_4c8.NumData = 0;
    ValueIterator::ValueIterator(&local_4c8);
    local_598.Current.HdrData = (HeaderData *)0x0;
    local_598.DataOffset = 0;
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x20] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x21] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x22] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x23] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x24] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x25] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x26] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x27] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x28] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x29] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2a] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2b] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2c] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2d] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2e] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x2f] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x10] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x11] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x12] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x13] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x14] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x15] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x16] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x17] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x18] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x19] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1a] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1b] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1c] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1d] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1e] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0x1f] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[1] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[2] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[3] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[4] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[5] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[6] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[7] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[8] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[9] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[10] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0xb] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0xc] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0xd] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0xe] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[2].buffer[0xf] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x20] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x21] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x22] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x23] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x24] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x25] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x26] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x27] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x28] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x29] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2a] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2b] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2c] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2d] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2e] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x2f] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x10] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x11] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x12] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x13] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x14] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x15] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x16] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x17] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x18] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x19] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1a] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1b] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1c] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1d] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1e] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0x1f] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[1] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[2] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[3] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[4] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[5] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[6] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[7] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[8] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[9] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[10] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0xb] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0xc] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0xd] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0xe] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[1].buffer[0xf] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x20] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x21] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x22] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x23] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x24] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x25] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x26] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x27] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x28] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x29] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2a] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2b] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2c] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2d] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2e] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x2f] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x10] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x11] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x12] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x13] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x14] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x15] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x16] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x17] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x18] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x19] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1a] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1b] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1c] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1d] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1e] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0x1f] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[1] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[2] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[3] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[4] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[5] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[6] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[7] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[8] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[9] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[10] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0xb] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0xc] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0xd] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0xe] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.
    InlineElts[0].buffer[0xf] = '\0';
    local_598.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
         (void *)0x0;
    local_598.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size = 0;
    local_598.Current.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity = 0;
    local_598.AccelTable = (AppleAcceleratorTable *)0x0;
    local_598.Current.super_Entry._vptr_Entry = (_func_int **)0x0;
    local_598.Data = 0;
    local_598.NumData = 0;
    ValueIterator::ValueIterator(&local_598);
    make_range<llvm::AppleAcceleratorTable::ValueIterator>
              (__return_storage_ptr__,&local_4c8,&local_598);
    ValueIterator::~ValueIterator(&local_598);
    ValueIterator::~ValueIterator(&local_4c8);
  }
  return __return_storage_ptr__;
}

Assistant:

iterator_range<AppleAcceleratorTable::ValueIterator>
AppleAcceleratorTable::equal_range(StringRef Key) const {
  if (!IsValid)
    return make_range(ValueIterator(), ValueIterator());

  // Find the bucket.
  unsigned HashValue = djbHash(Key);
  unsigned Bucket = HashValue % Hdr.BucketCount;
  uint64_t BucketBase = sizeof(Hdr) + Hdr.HeaderDataLength;
  uint64_t HashesBase = BucketBase + Hdr.BucketCount * 4;
  uint64_t OffsetsBase = HashesBase + Hdr.HashCount * 4;

  uint64_t BucketOffset = BucketBase + Bucket * 4;
  unsigned Index = AccelSection.getU32(&BucketOffset);

  // Search through all hashes in the bucket.
  for (unsigned HashIdx = Index; HashIdx < Hdr.HashCount; ++HashIdx) {
    uint64_t HashOffset = HashesBase + HashIdx * 4;
    uint64_t OffsetsOffset = OffsetsBase + HashIdx * 4;
    uint32_t Hash = AccelSection.getU32(&HashOffset);

    if (Hash % Hdr.BucketCount != Bucket)
      // We are already in the next bucket.
      break;

    uint64_t DataOffset = AccelSection.getU32(&OffsetsOffset);
    uint64_t StringOffset = AccelSection.getRelocatedValue(4, &DataOffset);
    if (!StringOffset)
      break;

    // Finally, compare the key.
    if (Key == StringSection.getCStr(&StringOffset))
      return make_range({*this, DataOffset}, ValueIterator());
  }
  return make_range(ValueIterator(), ValueIterator());
}